

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O0

char * file_stdio_ferrmsg(ALLEGRO_FILE *f)

{
  int iVar1;
  USERDATA *pUVar2;
  int rc;
  USERDATA *userdata;
  ALLEGRO_FILE *in_stack_ffffffffffffffd8;
  char *local_8;
  
  pUVar2 = get_userdata(in_stack_ffffffffffffffd8);
  if (pUVar2->errnum == 0) {
    local_8 = "";
  }
  else {
    iVar1 = __xpg_strerror_r(pUVar2->errnum,pUVar2->errmsg,0x50);
    if (iVar1 == 0) {
      local_8 = pUVar2->errmsg;
    }
    else {
      local_8 = "";
    }
  }
  return local_8;
}

Assistant:

static const char *file_stdio_ferrmsg(ALLEGRO_FILE *f)
{
   USERDATA *userdata = get_userdata(f);

   if (userdata->errnum == 0)
      return "";

   /* Note: at this time MinGW has neither strerror_r nor strerror_s. */
#if defined(ALLEGRO_HAVE_STRERROR_R)
   {
      int rc = strerror_r(userdata->errnum, userdata->errmsg,
         sizeof(userdata->errmsg));
      if (rc == 0) {
         return userdata->errmsg;
      }
   }
#endif

#if defined(ALLEGRO_HAVE_STRERROR_S)
   {
      errno_t rc = strerror_s(userdata->errmsg, sizeof(userdata->errmsg),
         userdata->errnum);
      if (rc == 0) {
         return userdata->errmsg;
      }
   }
#endif

   return "";
}